

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

void __thiscall
spvtools::opt::IRContext::EmitErrorMessage(IRContext *this,string *message,Instruction *inst)

{
  bool bVar1;
  uint32_t id;
  MessageConsumer *pMVar2;
  vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *pvVar3;
  DefUseManager *this_00;
  Operand *this_01;
  char *__args_1;
  char *__args_3;
  spv_position_t local_d0;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  Instruction *local_58;
  Instruction *file_name;
  string source;
  uint32_t col_number;
  uint32_t line_number;
  Instruction *line_inst;
  Instruction *inst_local;
  string *message_local;
  IRContext *this_local;
  
  pMVar2 = consumer(this);
  bVar1 = std::function::operator_cast_to_bool((function *)pMVar2);
  _col_number = inst;
  if (bVar1) {
    for (; _col_number != (Instruction *)0x0;
        _col_number = utils::IntrusiveNodeBase<spvtools::opt::Instruction>::PreviousNode
                                (&_col_number->super_IntrusiveNodeBase<spvtools::opt::Instruction>))
    {
      pvVar3 = opt::Instruction::dbg_line_insts(_col_number);
      bVar1 = std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
              empty(pvVar3);
      if (!bVar1) {
        pvVar3 = opt::Instruction::dbg_line_insts(_col_number);
        _col_number = std::
                      vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                      ::back(pvVar3);
        bVar1 = opt::Instruction::IsNoLine(_col_number);
        if (bVar1) {
          _col_number = (Instruction *)0x0;
        }
        break;
      }
    }
    source.field_2._12_4_ = 0;
    source.field_2._8_4_ = 0;
    std::__cxx11::string::string((string *)&file_name);
    if (_col_number != (Instruction *)0x0) {
      this_00 = get_def_use_mgr(this);
      id = opt::Instruction::GetSingleWordInOperand(_col_number,0);
      local_58 = analysis::DefUseManager::GetDef(this_00,id);
      this_01 = opt::Instruction::GetInOperand(local_58,0);
      Operand::AsString_abi_cxx11_(&local_78,this_01);
      std::__cxx11::string::operator=((string *)&file_name,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      source.field_2._12_4_ = opt::Instruction::GetSingleWordInOperand(_col_number,1);
      source.field_2._8_4_ = opt::Instruction::GetSingleWordInOperand(_col_number,2);
    }
    opt::Instruction::PrettyPrint_abi_cxx11_(&local_b8,inst,0x40);
    std::operator+(&local_98,"\n  ",&local_b8);
    std::__cxx11::string::operator+=((string *)message,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    pMVar2 = consumer(this);
    __args_1 = (char *)std::__cxx11::string::c_str();
    local_d0.line = (size_t)(uint)source.field_2._12_4_;
    local_d0.column = (size_t)(uint)source.field_2._8_4_;
    local_d0.index = 0;
    __args_3 = (char *)std::__cxx11::string::c_str();
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(pMVar2,SPV_MSG_ERROR,__args_1,&local_d0,__args_3);
    std::__cxx11::string::~string((string *)&file_name);
  }
  return;
}

Assistant:

void IRContext::EmitErrorMessage(std::string message, Instruction* inst) {
  if (!consumer()) {
    return;
  }

  Instruction* line_inst = inst;
  while (line_inst != nullptr) {  // Stop at the beginning of the basic block.
    if (!line_inst->dbg_line_insts().empty()) {
      line_inst = &line_inst->dbg_line_insts().back();
      if (line_inst->IsNoLine()) {
        line_inst = nullptr;
      }
      break;
    }
    line_inst = line_inst->PreviousNode();
  }

  uint32_t line_number = 0;
  uint32_t col_number = 0;
  std::string source;
  if (line_inst != nullptr) {
    Instruction* file_name =
        get_def_use_mgr()->GetDef(line_inst->GetSingleWordInOperand(0));
    source = file_name->GetInOperand(0).AsString();

    // Get the line number and column number.
    line_number = line_inst->GetSingleWordInOperand(1);
    col_number = line_inst->GetSingleWordInOperand(2);
  }

  message +=
      "\n  " + inst->PrettyPrint(SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
  consumer()(SPV_MSG_ERROR, source.c_str(), {line_number, col_number, 0},
             message.c_str());
}